

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O1

Factor * __thiscall libDAI::LCLin::Fdel(Factor *__return_storage_ptr__,LCLin *this,size_t i)

{
  Factor *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFactor<double> *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Var *n;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> pfacs;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_e8;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> local_c8
  ;
  Factor *local_b0;
  size_t local_a8;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> local_a0
  ;
  VarSet local_88;
  TFactor<double> local_68;
  
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = __return_storage_ptr__;
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  plVar5 = *(long **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x70) + i * 0x18);
  local_a8 = i;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (plVar5 == *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x70) + 8 + i * 0x18))
    break;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_01,iVar2),*plVar5);
    lVar3 = *plVar5;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::operator*
              (&local_68,this_00,
               (this->_phis).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 0x58) + i * 0x18) +
                        lVar3 * 8));
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&local_e8,
               &local_68);
    if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    plVar5 = plVar5 + 1;
  }
  if (local_e8.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&((local_e8.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar3);
      std::vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>::
      emplace_back<libDAI::TFactor<double>const*>
                ((vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>
                  *)&local_c8,(TFactor<double> **)&local_68);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (uVar4 < (ulong)(((long)local_e8.
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x30))
                       ((long *)CONCAT44(extraout_var_03,iVar2),local_a8);
  VarSet::VarSet(&local_88,n);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector(&local_a0,&local_c8);
  pFVar1 = local_b0;
  notSumProd(local_b0,this,&local_88,&local_a0);
  if (local_a0.
      super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.
      super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_e8);
  return pFVar1;
}

Assistant:

Factor LCLin::Fdel( size_t i ) { 
        std::vector<Factor> facs;
        std::vector<const Factor *> pfacs;
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ )
            facs.push_back( grm().factor(*I) * phi(i,*I) );
        for( size_t K = 0; K < facs.size(); K++ )
            pfacs.push_back( &(facs[K]) );
        return notSumProd( grm().var(i), pfacs );
    }